

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

void __thiscall BoardView::Mirror(BoardView *this)

{
  undefined8 *puVar1;
  long *plVar2;
  long lVar3;
  pointer pAVar4;
  float fVar5;
  int iVar6;
  Annotation *ann;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer pAVar7;
  iterator __begin1;
  undefined8 *puVar8;
  long *plVar9;
  shared_ptr<Point> *p;
  undefined8 *puVar10;
  size_t i;
  long lVar11;
  long lVar12;
  float fVar13;
  
  iVar6 = (*this->m_board->_vptr_Board[5])();
  puVar1 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var,iVar6))[1];
  fVar13 = 1.1754944e-38;
  puVar8 = *(undefined8 **)CONCAT44(extraout_var,iVar6);
  for (puVar10 = puVar8; puVar10 != puVar1; puVar10 = puVar10 + 2) {
    fVar5 = *(float *)*puVar10;
    if (*(float *)*puVar10 <= fVar13) {
      fVar5 = fVar13;
    }
    fVar13 = fVar5;
  }
  for (; puVar8 != puVar1; puVar8 = puVar8 + 2) {
    *(float *)*puVar8 = fVar13 - *(float *)*puVar8;
  }
  iVar6 = (*this->m_board->_vptr_Board[4])();
  plVar2 = (long *)((undefined8 *)CONCAT44(extraout_var_00,iVar6))[1];
  for (plVar9 = *(long **)CONCAT44(extraout_var_00,iVar6); plVar9 != plVar2; plVar9 = plVar9 + 2) {
    *(float *)(*plVar9 + 0x50) = fVar13 - *(float *)(*plVar9 + 0x50);
  }
  iVar6 = (*this->m_board->_vptr_Board[3])();
  plVar2 = (long *)((undefined8 *)CONCAT44(extraout_var_01,iVar6))[1];
  for (plVar9 = *(long **)CONCAT44(extraout_var_01,iVar6); plVar9 != plVar2; plVar9 = plVar9 + 2) {
    lVar3 = *plVar9;
    *(float *)(lVar3 + 0xd0) = fVar13 - *(float *)(lVar3 + 0xd0);
    if (*(char *)(lVar3 + 0xa0) == '\x01') {
      for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
        *(float *)(lVar3 + 0x70 + lVar11 * 8) = fVar13 - *(float *)(lVar3 + 0x70 + lVar11 * 8);
      }
    }
    lVar11 = *(long *)(lVar3 + 0xa8);
    lVar3 = *(long *)(lVar3 + 0xb0);
    for (lVar12 = 0; lVar3 - lVar11 >> 3 != lVar12; lVar12 = lVar12 + 1) {
      *(float *)(lVar11 + lVar12 * 8) = fVar13 - *(float *)(lVar11 + lVar12 * 8);
    }
  }
  pAVar4 = (this->m_annotations).annotations.
           super__Vector_base<Annotation,_std::allocator<Annotation>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pAVar7 = (this->m_annotations).annotations.
                super__Vector_base<Annotation,_std::allocator<Annotation>_>._M_impl.
                super__Vector_impl_data._M_start; pAVar7 != pAVar4; pAVar7 = pAVar7 + 1) {
    pAVar7->x = (double)fVar13 - pAVar7->x;
  }
  return;
}

Assistant:

void BoardView::Mirror(void) {
	auto &outline = m_board->OutlinePoints();
	ImVec2 min, max;

	// find the orthagonal bounding box
	// probably can put this as a predefined
	min.x = min.y = FLT_MAX;
	max.x = max.y = FLT_MIN;
	for (auto &p : outline) {
		if (p->x < min.x) min.x = p->x;
		if (p->y < min.y) min.y = p->y;
		if (p->x > max.x) max.x = p->x;
		if (p->y > max.y) max.y = p->y;
	}

	for (auto &p : outline) {
		p->x = max.x - p->x;
	}

	for (auto &p : m_board->Pins()) {
		//	auto p        = pin.get();
		p->position.x = max.x - p->position.x;
	}

	for (auto &part : m_board->Components()) {

		part->centerpoint.x = max.x - part->centerpoint.x;

		if (part->outline_done) {
			for (size_t i = 0; i < part->outline.size(); i++) {
				part->outline[i].x = max.x - part->outline[i].x;
			}
		}

		for (size_t i = 0; i < part->hull.size(); i++) {
			part->hull[i].x = max.x - part->hull[i].x;
		}
	}

	for (auto &ann : m_annotations.annotations) {
		ann.x = max.x - ann.x;
	}
}